

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMain.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing without intrinsics");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing using int128");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Compiler = clang");
  std::endl<char,std::char_traits<char>>(poVar1);
  cast_verify::CastVerify();
  mult_verify::MultVerify();
  div_verify::DivVerify();
  sub_verify::SubVerify();
  add_verify::AddVerify();
  mod_verify::ModVerify();
  incdec_verify::IncDecVerify();
  negation_verify::NegationVerify();
  return 0;
}

Assistant:

int main(int, char**)
{
    #if SAFEINT_USE_INTRINSICS == 0
    std::cout << "Testing without intrinsics" << std::endl;
    #else
    std::cout << "Testing with intrinsics" << std::endl;
    #endif

    #if SAFEINT_HAS_INT128 == 1
    std::cout << "Testing using int128" << std::endl;
    #else
    std::cout << "Testing not using int128" << std::endl;
    #endif

    #if SAFEINT_COMPILER == GCC_COMPILER 
    std::cout << "Compiler = g++" << std::endl;
    #endif
    
    #if SAFEINT_COMPILER == CLANG_COMPILER
    std::cout << "Compiler = clang" << std::endl;
    #endif

    #if SAFEINT_COMPILER == VISUAL_STUDIO_COMPILER
    std::cout << "Compiler = Visual Studio" << std::endl;
    #endif

    cast_verify::CastVerify();
    mult_verify::MultVerify();
    div_verify::DivVerify();
    sub_verify::SubVerify();
    add_verify::AddVerify();
    mod_verify::ModVerify();
    incdec_verify::IncDecVerify();
    negation_verify::NegationVerify();
    return 0;
}